

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiEventList.cpp
# Opt level: O2

void __thiscall smf::MidiEventList::clear(MidiEventList *this)

{
  pointer ppMVar1;
  MidiEvent *this_00;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> *__range1;
  MidiEvent **item;
  pointer ppMVar2;
  
  ppMVar1 = (this->list).super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppMVar2 = (this->list).
                 super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar2 != ppMVar1; ppMVar2 = ppMVar2 + 1) {
    this_00 = *ppMVar2;
    if (this_00 != (MidiEvent *)0x0) {
      MidiEvent::~MidiEvent(this_00);
      operator_delete(this_00);
      *ppMVar2 = (MidiEvent *)0x0;
    }
  }
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::resize(&this->list,0);
  return;
}

Assistant:

void MidiEventList::clear(void) {
	for (auto& item : list) {
		if (item != NULL) {
			delete item;
			item = NULL;
		}
	}
	list.resize(0);
}